

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_pain(void)

{
  int local_10;
  int local_c;
  wchar_t i;
  wchar_t idx;
  
  for (local_c = 0; local_c < (int)(uint)z_info->mp_max; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 7; local_10 = local_10 + 1) {
      string_free(pain_messages[local_c].messages[local_10]);
    }
  }
  mem_free(pain_messages);
  return;
}

Assistant:

static void cleanup_pain(void)
{
	int idx, i;
	for (idx = 0; idx < z_info->mp_max; idx++) {
		for (i = 0; i < 7; i++) {
			string_free((char *)pain_messages[idx].messages[i]);
		}
	}
	mem_free(pain_messages);
}